

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O1

void protodec_generate_nmea(demod_state_t *d,int bufferlen,int fillbits,time_t received_t)

{
  char *pcVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  bool bVar13;
  
  bVar10 = 1;
  if (0x150 < bufferlen) {
    bVar10 = ((char)((ulong)((uint)bufferlen >> 4) / 0x15) + '\x01') -
             (((uint)(bufferlen * 0x3cf3cf3d) >> 4 | bufferlen * -0x30000000) < 0xc30c31);
  }
  bVar13 = 1 < bVar10;
  bVar3 = 1;
  if (bVar13) {
    bVar3 = bVar10;
  }
  bVar12 = 0;
  lVar7 = 0;
  do {
    uVar2 = (ulong)(bVar13 + 0xe);
    if ((int)lVar7 < bufferlen) {
      lVar7 = (long)(int)lVar7;
      do {
        lVar9 = -6;
        bVar4 = 5;
        uVar6 = 0;
        do {
          uVar6 = uVar6 | (uint)d->rbuffer[lVar9 + lVar7 + 6] << (bVar4 & 0x1f);
          bVar4 = bVar4 - 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0);
        d->nmea[uVar2] = (char)uVar6 + (0x27 < (uVar6 & 0xf8)) * '\b' + '0';
        lVar7 = lVar7 + 6;
        uVar2 = uVar2 + 1;
      } while ((uVar2 < (bVar13 | 0x46)) && (lVar7 < bufferlen));
    }
    bVar12 = bVar12 + 1;
    builtin_strncpy(d->nmea,"!AIVDM,0,0,",0xb);
    d->nmea[7] = d->nmea[7] + bVar10;
    d->nmea[9] = d->nmea[9] + bVar12;
    uVar11 = uVar2 & 0xffffffff;
    builtin_strncpy(d->nmea + uVar11,",0*00",6);
    if (bVar10 < 2) {
      d->nmea[0xb] = ',';
      d->nmea[0xc] = d->chanid;
      d->nmea[0xd] = ',';
    }
    else {
      d->nmea[0xb] = d->seqnr + '0';
      d->nmea[0xc] = ',';
      d->nmea[0xd] = d->chanid;
      d->nmea[0xe] = ',';
      if (bVar12 == bVar10) {
        d->nmea[uVar11 + 1] = (char)fillbits + '0';
      }
    }
    pcVar1 = d->nmea;
    bVar4 = pcVar1[1];
    bVar5 = pcVar1[2];
    if (bVar5 != 0x2a) {
      pbVar8 = (byte *)(pcVar1 + 3);
      do {
        bVar4 = bVar4 ^ bVar5;
        bVar5 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while (bVar5 != 0x2a);
    }
    sprintf(pcVar1 + uVar11 + 3,"%02X\r\n",(ulong)bVar4);
    if (on_nmea_sentence_received != (decoder_on_nmea_sentence_received)0x0) {
      (*on_nmea_sentence_received)(d->nmea,(int)uVar2 + 7,bVar10,bVar12);
    }
  } while (bVar12 != bVar3);
  return;
}

Assistant:

void protodec_generate_nmea(struct demod_state_t *d, int bufferlen, int fillbits, time_t received_t)
{
	int senlen;
	int pos;
    int k, offset;
	int m;
    unsigned char sentences, sentencenum, nmeachk, letter;
	
	//6bits to nmea-ascii. One sentence len max 82char
	//inc. head + tail.This makes inside datamax 62char multipart, 62 single
    senlen = 56;		//this is normally not needed.For testing only. May be fixed number
    if (bufferlen <= (senlen * 6)) {
		sentences = 1;
	} else {
		sentences = bufferlen / (senlen * 6);
		//sentences , if overflow put one more
		if (bufferlen % (senlen * 6) != 0)
			sentences++;
	};

    sentencenum = 0;
	pos = 0;
    offset = (sentences>1) ? 15 : 14;
	do {
        k = offset;		//leave room for nmea header
        while (k < senlen + offset && bufferlen > pos) {
            letter = (unsigned char)protodec_henten(pos, 6, d->rbuffer);
			// 6bit-to-ascii conversion by IEC
            letter += (letter < 40) ? 48 : 56;
			d->nmea[k] = letter;
			pos += 6;
			k++;
		}
		sentencenum++;
		
        memcpy(&d->nmea[0], "!AIVDM,0,0,", 11);
        d->nmea[7] += sentences;
        d->nmea[9] += sentencenum;

        memcpy(&d->nmea[k], ",0*00\0", 6);
		
		if (sentences > 1) {
            d->nmea[11] = '0' + d->seqnr;
            d->nmea[12] = ',';
            d->nmea[13] = d->chanid;
            d->nmea[14] = ',';
            if (sentencenum == sentences) d->nmea[k + 1] = '0' + fillbits;
        } else {
            d->nmea[11] = ',';
            d->nmea[12] = d->chanid;
            d->nmea[13] = ',';
		}

        m = 1;
        nmeachk = d->nmea[m++];
        while (d->nmea[m] != '*') nmeachk ^= d->nmea[m++];

        sprintf(&d->nmea[k + 3], "%02X\r\n", nmeachk);
        if (on_nmea_sentence_received != NULL)
            on_nmea_sentence_received(d->nmea, k+7, sentences, sentencenum);
    } while (sentencenum < sentences);
}